

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_ref(irGenerator *this,LeftVal *dest,LeftVal *src,bool begin)

{
  uint32_t uVar1;
  LabelId LVar2;
  VarId *__p;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p_00;
  _Variant_storage<false,mir::inst::VarId,std::__cxx11::string> *__p_01;
  RefInst *this_00;
  __shared_ptr<mir::inst::RefInst,_(__gnu_cxx::_Lock_policy)2> _Stack_f8;
  shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  shared_ptr<mir::inst::VarId> destVarId;
  shared_ptr<mir::inst::Inst> refInst;
  VarId local_b0;
  string local_a0;
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  val.
  super___shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  val.
  super___shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  refInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  refInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (VarId *)operator_new(0x10);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_58,
                    (_Copy_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)dest);
  uVar1 = LeftValueToLabelId(this,(LeftVal *)&local_58);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  __p->id = uVar1;
  std::__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::VarId,void>
            ((__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2> *)&_Stack_f8,__p);
  std::__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2> *)&_Stack_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f8._M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_58);
  pvVar3 = std::get<1ul,int,std::__cxx11::string>(src);
  std::__cxx11::string::string((string *)&local_a0,(string *)pvVar3);
  LVar2 = nameToLabelId(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (LVar2 < 0) {
    __p_01 = (_Variant_storage<false,mir::inst::VarId,std::__cxx11::string> *)operator_new(0x28);
    pvVar3 = std::get<1ul,int,std::__cxx11::string>(src);
    std::__detail::__variant::_Variant_storage<false,mir::inst::VarId,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>(__p_01,pvVar3);
    std::
    __shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,void>
              ((__shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                *)&_Stack_f8,
               (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__p_01);
  }
  else {
    __p_00 = (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x28);
    *(undefined ***)
     &(__p_00->
      super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_u =
         &PTR_display_001d90d0;
    *(LabelId *)
     ((long)&(__p_00->
             super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
             super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
             super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_u
     + 8) = LVar2;
    (__p_00->
    super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_index =
         '\0';
    std::
    __shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,void>
              ((__shared_ptr<std::variant<mir::inst::VarId,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                *)&_Stack_f8,__p_00);
  }
  std::
  __shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&val.
               super___shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&_Stack_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f8._M_refcount);
  this_00 = (RefInst *)operator_new(0x40);
  local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_b0.id = (destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->id;
  std::__detail::__variant::
  _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_80,
                    (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)val.
                       super___shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  mir::inst::RefInst::RefInst
            (this_00,&local_b0,
             (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_80);
  std::__shared_ptr<mir::inst::RefInst,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::RefInst,void>
            ((__shared_ptr<mir::inst::RefInst,(__gnu_cxx::_Lock_policy)2> *)&_Stack_f8,this_00);
  std::__shared_ptr<mir::inst::Inst,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<mir::inst::Inst,(__gnu_cxx::_Lock_policy)2> *)&refInst,&_Stack_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f8._M_refcount);
  std::__detail::__variant::
  _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_80);
  insertInstruction(this,&refInst,begin);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&refInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&val.
              super___shared_ptr<std::variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void irGenerator::ir_ref(LeftVal dest, LeftVal src, bool begin) {
  shared_ptr<VarId> destVarId;
  shared_ptr<std::variant<VarId, std::string>> val;
  LabelId id;
  shared_ptr<mir::inst::Inst> refInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  if ((id = nameToLabelId(get<1>(src))) >= 0) {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(VarId(id)));
  } else {
    val = shared_ptr<std::variant<VarId, std::string>>(
        new std::variant<VarId, std::string>(get<1>(src)));
  }

  refInst =
      shared_ptr<mir::inst::RefInst>(new mir::inst::RefInst(*destVarId, *val));

  insertInstruction(refInst, begin);
}